

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<TestResult_(mp::PLTerm)>::TypedExpectation
          (TypedExpectation<TestResult_(mp::PLTerm)> *this,
          FunctionMockerBase<TestResult_(mp::PLTerm)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001cd0e0;
  this->owner_ = owner;
  Matcher<mp::PLTerm>::Matcher((Matcher<mp::PLTerm> *)&this->matchers_,(Matcher<mp::PLTerm> *)m);
  A<std::tuple<mp::PLTerm>const&>();
  (this->repeated_action_).impl_.value_ = (ActionInterface<TestResult_(mp::PLTerm)> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}